

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

int __thiscall Parser::getTokenPrecedence(Parser *this)

{
  Token *this_00;
  TokenType TVar1;
  OperatorChar OVar2;
  int iVar3;
  _Hashtable<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var4;
  const_iterator cVar5;
  long *plVar6;
  undefined8 extraout_RAX;
  CalculationEngine *pCVar7;
  long *plVar8;
  Parser *this_01;
  OperatorChar op;
  key_type local_7c;
  CalculationEngine *local_78;
  pointer local_70;
  pointer local_68;
  pointer pTStack_60;
  string local_58;
  string local_38;
  
  this_00 = &this->mCurrentToken;
  TVar1 = Token::type(this_00);
  if ((TVar1 != OPERATOR) && (TVar1 = Token::type(this_00), TVar1 != TWO_CHAR_OPERATOR)) {
    return -1;
  }
  OVar2 = anon_unknown.dwarf_89a83::tokenAsOperator(this_00);
  local_7c._0_2_ = OVar2._0_2_;
  local_7c.mOp2 = OVar2.mOp2;
  p_Var4 = &CalculationEngine::binaryOperators(this->mCalcEngine)->_M_h;
  cVar5 = std::
          _Hashtable<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(p_Var4,&local_7c);
  if (cVar5.super__Node_iterator_base<std::pair<const_OperatorChar,_Operator>,_true>._M_cur ==
      (__node_type *)0x0) {
    OperatorChar::toString_abi_cxx11_(&local_38,&local_7c);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x139265);
    local_78 = (CalculationEngine *)*plVar6;
    pCVar7 = (CalculationEngine *)(plVar6 + 2);
    if (local_78 == pCVar7) {
      local_68 = *(pointer *)pCVar7;
      pTStack_60 = (pointer)plVar6[3];
      local_78 = (CalculationEngine *)&local_68;
    }
    else {
      local_68 = *(pointer *)pCVar7;
    }
    local_70 = (pointer)plVar6[1];
    this_01 = (Parser *)&local_78;
    *plVar6 = (long)pCVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)this_01);
    local_58._M_dataplus._M_p = (pointer)*plVar6;
    plVar8 = plVar6 + 2;
    if ((long *)local_58._M_dataplus._M_p == plVar8) {
      local_58.field_2._M_allocated_capacity = *plVar8;
      local_58.field_2._8_8_ = plVar6[3];
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    }
    else {
      local_58.field_2._M_allocated_capacity = *plVar8;
    }
    local_58._M_string_length = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    parseError(this_01,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,(ulong)(local_58.field_2._M_allocated_capacity + 1))
      ;
    }
    if (local_78 != (CalculationEngine *)&local_68) {
      operator_delete(local_78,(ulong)&local_68->field_0x1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  p_Var4 = &CalculationEngine::binaryOperators(this->mCalcEngine)->_M_h;
  cVar5 = std::
          _Hashtable<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(p_Var4,&local_7c);
  if (cVar5.super__Node_iterator_base<std::pair<const_OperatorChar,_Operator>,_true>._M_cur !=
      (__node_type *)0x0) {
    iVar3 = Operator::precedence
                      ((Operator *)
                       ((long)cVar5.
                              super__Node_iterator_base<std::pair<const_OperatorChar,_Operator>,_true>
                              ._M_cur + 0x10));
    return iVar3;
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

int Parser::getTokenPrecedence() {
	if (mCurrentToken.type() != TokenType::OPERATOR && mCurrentToken.type() != TokenType::TWO_CHAR_OPERATOR) {
		return -1;
	}

	auto op = tokenAsOperator(mCurrentToken);
	if (mCalcEngine.binaryOperators().count(op) > 0) {
		return mCalcEngine.binaryOperators().at(op).precedence();
	} else {
		parseError("'" + op.toString() + "' is not a defined binary operator.");
	}

	return -1;
}